

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O3

void test_region_points(Am_Region *rgn,int x,int y,bool val)

{
  char cVar1;
  char error [200];
  char acStack_e8 [208];
  
  cVar1 = (**(code **)(*(long *)rgn + 0x10))();
  if ((bool)cVar1 == val) {
    return;
  }
  sprintf(acStack_e8,"** test_region_points failed with  x = %d,  y = %d,  val = %d.\n",x,
          (ulong)(uint)y,val);
  Am_Error(acStack_e8);
}

Assistant:

void
test_region_points(Am_Region *rgn, int x, int y, bool val)
{
  if (!(rgn->In(x, y) == val)) {
    char error[200];
    sprintf(error, "** test_region_points failed with  x = %d,  y = %d, "
                   " val = %d.\n",
            x, y, val);
    Am_Error(error);
  }
}